

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_identity.cc
# Opt level: O0

void absl::lts_20250127::base_internal::ClearCurrentThreadIdentity(void)

{
  ThreadIdentity *pTVar1;
  
  pTVar1 = CurrentThreadIdentityIfPresent();
  if (pTVar1 == (ThreadIdentity *)0x0) {
    return;
  }
  __assert_fail("CurrentThreadIdentityIfPresent() == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/base/internal/thread_identity.cc"
                ,0x92,"void absl::base_internal::ClearCurrentThreadIdentity()");
}

Assistant:

void ClearCurrentThreadIdentity() {
#if ABSL_THREAD_IDENTITY_MODE == ABSL_THREAD_IDENTITY_MODE_USE_TLS || \
    ABSL_THREAD_IDENTITY_MODE == ABSL_THREAD_IDENTITY_MODE_USE_CPP11
  thread_identity_ptr = nullptr;
#elif ABSL_THREAD_IDENTITY_MODE == \
    ABSL_THREAD_IDENTITY_MODE_USE_POSIX_SETSPECIFIC
  // pthread_setspecific expected to clear value on destruction
  assert(CurrentThreadIdentityIfPresent() == nullptr);
#endif
}